

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O2

void secp256k1_fe_add_int(secp256k1_fe *r,int a)

{
  secp256k1_fe_verify(r);
  r->n[0] = r->n[0] + (ulong)(uint)a;
  r->magnitude = r->magnitude + 1;
  r->normalized = 0;
  secp256k1_fe_verify(r);
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_add_int(secp256k1_fe *r, int a) {
    VERIFY_CHECK(0 <= a && a <= 0x7FFF);
    secp256k1_fe_verify(r);
    secp256k1_fe_impl_add_int(r, a);
    r->magnitude += 1;
    r->normalized = 0;
    secp256k1_fe_verify(r);
}